

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Document::~Document(Document *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  FileGlobalSettings *__ptr;
  pointer ppAVar3;
  pointer puVar4;
  pointer pcVar5;
  _Rb_tree_node_base *p_Var6;
  
  for (p_Var6 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    p_Var2 = p_Var6[1]._M_parent;
    if ((p_Var2 != (_Base_ptr)0x0) && (p_Var2->_M_left != (_Base_ptr)0x0)) {
      (**(code **)(*(long *)p_Var2->_M_left + 8))();
    }
    operator_delete(p_Var2,0x28);
  }
  for (p_Var6 = (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->src_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    p_Var2 = p_Var6[1]._M_parent;
    if (p_Var2 != (_Base_ptr)0x0) {
      if (p_Var2->_M_parent != (_Base_ptr)&p_Var2->_M_right) {
        operator_delete(p_Var2->_M_parent,(ulong)((long)&p_Var2->_M_right->_M_color + 1));
      }
    }
    operator_delete(p_Var2,0x40);
  }
  __ptr = (this->globals)._M_t.
          super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
          .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
  if (__ptr != (FileGlobalSettings *)0x0) {
    std::default_delete<Assimp::FBX::FileGlobalSettings>::operator()
              ((default_delete<Assimp::FBX::FileGlobalSettings> *)&this->globals,__ptr);
  }
  (this->globals)._M_t.
  super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl =
       (FileGlobalSettings *)0x0;
  ppAVar3 = (this->animationStacksResolved).
            super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 != (pointer)0x0) {
    operator_delete(ppAVar3,(long)(this->animationStacksResolved).
                                  super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar3
                   );
  }
  puVar4 = (this->animationStacks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->animationStacks).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  pcVar5 = (this->creator)._M_dataplus._M_p;
  paVar1 = &(this->creator).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::~_Rb_tree(&(this->dest_connections)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::~_Rb_tree(&(this->src_connections)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
  ::~_Rb_tree(&(this->templates)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  return;
}

Assistant:

Document::~Document()
{
    for(ObjectMap::value_type& v : objects) {
        delete v.second;
    }

    for(ConnectionMap::value_type& v : src_connections) {
        delete v.second;
    }
    // |dest_connections| contain the same Connection objects as the |src_connections|
}